

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * unifyValue(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  undefined1 auVar1 [12];
  mapped_type *pmVar2;
  mapped_type *this;
  Addr a2;
  Machine local_110;
  Machine local_a0;
  key_type local_2c [2];
  Register r_local;
  
  local_2c[0].r = r.r;
  if (m->mode == Write) {
    pmVar2 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,local_2c);
    this = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
    Hcell::operator=(this,pmVar2);
    (m->h).hix = (m->h).hix + 1;
  }
  else if (m->mode == Read) {
    Machine::Machine(&local_a0,m);
    auVar1._4_4_ = 0xffffffd6;
    auVar1._0_4_ = r.r;
    auVar1._8_4_ = 0;
    a2.hix_.hix = (m->s).hix;
    a2.tag_ = Heap;
    a2.r_.r = -0x2a;
    unify(&local_110,&local_a0,(Addr)(auVar1 << 0x20),a2);
    Machine::operator=(m,&local_110);
    Machine::~Machine(&local_110);
    Machine::~Machine(&local_a0);
  }
  (m->s).hix = (m->s).hix + 1;
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine unifyValue(Machine m, Register r) {
    switch (m.mode) {
        case Mode::Read:
            m = unify(m, r, m.s);
            break;
        case Mode::Write:
            m.heap[m.h] = m.regval[r];
            m.h += 1;
            break;
    }
    m.s += 1;
    return m;
}